

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t assignBuf(ion_bpp_handle_t handle,ion_bpp_address_t adr,ion_bpp_buffer_t **b)

{
  ion_bpp_buffer_tag *piVar1;
  ion_bpp_buffer_tag *piVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_buffer_tag *piVar4;
  ion_bpp_buffer_t *buf;
  
  if (adr == 0) {
    buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  }
  else {
    piVar1 = (ion_bpp_buffer_tag *)((long)handle + 0x48);
    piVar4 = *(ion_bpp_buffer_t **)((long)handle + 0x48);
    do {
      buf = piVar4;
      piVar4 = buf->next;
      if (piVar4 == piVar1) {
        if (buf->valid == boolean_false) {
          buf->adr = adr;
          goto LAB_0010acec;
        }
        break;
      }
    } while ((buf->valid == boolean_false) || (buf->adr != adr));
    if (buf->adr != adr) {
      if (buf->modified != boolean_false) {
        iVar3 = flush(handle,buf);
        if (iVar3 != bErrOk) {
          return iVar3;
        }
        piVar4 = buf->next;
      }
      buf->adr = adr;
      buf->valid = boolean_false;
    }
LAB_0010acec:
    piVar2 = buf->prev;
    piVar4->prev = piVar2;
    piVar2->next = piVar4;
    piVar4 = piVar1->next;
    buf->next = piVar4;
    buf->prev = piVar1;
    piVar4->prev = buf;
    buf->prev->next = buf;
  }
  *b = buf;
  return bErrOk;
}

Assistant:

static ion_bpp_err_t
assignBuf(
	ion_bpp_handle_t	handle,
	ion_bpp_address_t	adr,
	ion_bpp_buffer_t	**b
) {
	ion_bpp_h_node_t *h = handle;
	/* assign buf to adr */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	if (adr == 0) {
		*b = &h->root;
		return bErrOk;
	}

	/* search for buf with matching adr */
	buf = h->bufList.next;

	while (buf->next != &h->bufList) {
		if (buf->valid && (buf->adr == adr)) {
			break;
		}

		buf = buf->next;
	}

	/* either buf points to a match, or it's last one in list (LRR) */
	if (buf->valid) {
		if (buf->adr != adr) {
			if (buf->modified) {
				if ((rc = flush(handle, buf)) != 0) {
					return rc;
				}
			}

			buf->adr	= adr;
			buf->valid	= boolean_false;
		}
	}
	else {
		buf->adr = adr;
	}

	/* remove from current position and place at front of list */
	buf->next->prev = buf->prev;
	buf->prev->next = buf->next;
	buf->next		= h->bufList.next;
	buf->prev		= &h->bufList;
	buf->next->prev = buf;
	buf->prev->next = buf;
	*b				= buf;
	return bErrOk;
}